

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repattrn.cpp
# Opt level: O0

int32_t __thiscall
icu_63::RegexPattern::groupNumberFromName
          (RegexPattern *this,UnicodeString *groupName,UErrorCode *status)

{
  UBool UVar1;
  int32_t number;
  UErrorCode *status_local;
  UnicodeString *groupName_local;
  RegexPattern *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    this_local._4_4_ = uhash_geti_63(this->fNamedCaptureMap,groupName);
    if (this_local._4_4_ == 0) {
      *status = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t RegexPattern::groupNumberFromName(const UnicodeString &groupName, UErrorCode &status) const {
    if (U_FAILURE(status)) {
        return 0;
    }

    // No need to explicitly check for syntactically valid names.
    // Invalid ones will never be in the map, and the lookup will fail.

    int32_t number = uhash_geti(fNamedCaptureMap, &groupName);
    if (number == 0) {
        status = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
    }
    return number;
}